

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

int InjectFlushOrPushOutput
              (BrotliEncoderState *s,size_t *available_out,uint8_t **next_out,size_t *total_out)

{
  byte bVar1;
  ushort uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  anon_union_16_2_c961180f_for_tiny_buf_ *paVar7;
  ulong __n;
  size_t sVar8;
  
  if ((s->stream_state_ == BROTLI_STREAM_FLUSH_REQUESTED) &&
     (bVar1 = s->last_bytes_bits_, bVar1 != 0)) {
    uVar2 = s->last_bytes_;
    s->last_bytes_ = 0;
    uVar4 = 6 << (bVar1 & 0x1f);
    s->last_bytes_bits_ = '\0';
    uVar6 = uVar2 | uVar4;
    if (s->next_out_ == (uint8_t *)0x0) {
      paVar7 = &s->tiny_buf_;
      s->next_out_ = (uint8_t *)paVar7;
    }
    else {
      paVar7 = (anon_union_16_2_c961180f_for_tiny_buf_ *)(s->next_out_ + s->available_out_);
    }
    paVar7->u8[0] = (uint8_t)uVar6;
    if (2 < bVar1) {
      paVar7->u8[1] = (uint8_t)(uVar6 >> 8);
    }
    if (10 < bVar1) {
      paVar7->u8[2] = (uint8_t)(uVar4 >> 0x10);
    }
    s->available_out_ = s->available_out_ + (ulong)(bVar1 + 0xd >> 3);
    iVar5 = 1;
  }
  else {
    uVar3 = s->available_out_;
    iVar5 = 0;
    if ((uVar3 != 0) && (__n = *available_out, iVar5 = 0, __n != 0)) {
      if (uVar3 < __n) {
        __n = uVar3;
      }
      memcpy(*next_out,s->next_out_,__n);
      *next_out = *next_out + __n;
      *available_out = *available_out - __n;
      s->next_out_ = s->next_out_ + __n;
      s->available_out_ = s->available_out_ - __n;
      sVar8 = __n + s->total_out_;
      s->total_out_ = sVar8;
      iVar5 = 1;
      if (total_out != (size_t *)0x0) {
        *total_out = sVar8;
      }
    }
  }
  return iVar5;
}

Assistant:

static BROTLI_BOOL InjectFlushOrPushOutput(BrotliEncoderState* s,
    size_t* available_out, uint8_t** next_out, size_t* total_out) {
  if (s->stream_state_ == BROTLI_STREAM_FLUSH_REQUESTED &&
      s->last_bytes_bits_ != 0) {
    InjectBytePaddingBlock(s);
    return BROTLI_TRUE;
  }

  if (s->available_out_ != 0 && *available_out != 0) {
    size_t copy_output_size =
        BROTLI_MIN(size_t, s->available_out_, *available_out);
    memcpy(*next_out, s->next_out_, copy_output_size);
    *next_out += copy_output_size;
    *available_out -= copy_output_size;
    s->next_out_ += copy_output_size;
    s->available_out_ -= copy_output_size;
    s->total_out_ += copy_output_size;
    if (total_out) *total_out = s->total_out_;
    return BROTLI_TRUE;
  }

  return BROTLI_FALSE;
}